

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::FileEntry::listentry(FileEntry *this,ImgfsFile *imgfs)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  anon_class_16_2_150f306b fn;
  ulong uVar5;
  uint16_t cputype;
  uint32_t uVar6;
  uint uVar7;
  uint64_t uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 in_stack_fffffffffffffda8;
  undefined4 uVar12;
  ByteVector local_1b8;
  undefined1 local_1a0 [8];
  exe_reconstructor exe;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_68;
  string local_48;
  ulong local_28;
  size_t compsize;
  ImgfsFile *imgfs_local;
  FileEntry *this_local;
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  compsize = (size_t)imgfs;
  imgfs_local = (ImgfsFile *)this;
  if (g_verbose < 2) {
    uVar6 = DirEntry::offset(&this->super_DirEntry);
    uVar1 = (this->super_DirEntry)._size;
    uVar7 = 0x4d;
    if ((this->super_DirEntry)._magic == 0xfffff6fe) {
      uVar7 = 0x46;
    }
    uVar2 = this->_sectionlist;
    uVar4 = this->_attr;
    uVar8 = getunixtime(this);
    unixtime2string_abi_cxx11_(&local_b8,uVar8);
    uVar9 = std::__cxx11::string::c_str();
    DirEntry::entstring_abi_cxx11_(&local_d8,&this->super_DirEntry);
    uVar10 = std::__cxx11::string::c_str();
    nameinfo::name_abi_cxx11_(&local_f8,&this->_name,(ImgfsFile *)compsize);
    uVar11 = std::__cxx11::string::c_str();
    printf("%08x: %c:s->%08x %9d [%08x] %s  %s %s\n",(ulong)uVar6,(ulong)uVar7,(ulong)uVar2,
           (ulong)uVar1,(ulong)uVar4,uVar9,uVar10,uVar11);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    local_28 = DirEntry::calc_compressed_size(&this->super_DirEntry,imgfs);
    uVar6 = DirEntry::offset(&this->super_DirEntry);
    uVar5 = local_28;
    uVar1 = (this->super_DirEntry)._size;
    uVar7 = 0x4d;
    if ((this->super_DirEntry)._magic == 0xfffff6fe) {
      uVar7 = 0x46;
    }
    uVar2 = this->_sectionlist;
    uVar3 = this->_attr;
    uVar8 = getunixtime(this);
    unixtime2string_abi_cxx11_(&local_48,uVar8);
    uVar9 = std::__cxx11::string::c_str();
    DirEntry::entstring_abi_cxx11_(&local_68,&this->super_DirEntry);
    uVar10 = std::__cxx11::string::c_str();
    nameinfo::name_abi_cxx11_(&local_98,&this->_name,(ImgfsFile *)compsize);
    uVar11 = std::__cxx11::string::c_str();
    printf("%08x: %c:s->%08x %9d %9d [%08x] %s  %s %s\n",(ulong)uVar6,(ulong)uVar7,(ulong)uVar2,
           (ulong)uVar1,uVar5 & 0xffffffff,CONCAT44(uVar12,uVar3),uVar9,uVar10,uVar11);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  exe._152_8_ = compsize;
  section_enumerator<ImgfsFile::FileEntry::listentry(ImgfsFile&)::_lambda(std::shared_ptr<ImgfsFile::SectionEntry>)_1_>
            (this,(ImgfsFile *)compsize,(anon_class_8_1_a814aef0)compsize);
  if ((g_verbose != 0) && (this->_sectionlist != 0)) {
    cputype = ImgfsFile::cputype((ImgfsFile *)compsize);
    exe_reconstructor::exe_reconstructor((exe_reconstructor *)local_1a0,cputype);
    DirEntry::getdatablock(&local_1b8,&this->super_DirEntry,(ImgfsFile *)compsize);
    exe_reconstructor::add_pe_data((exe_reconstructor *)local_1a0,&local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1b8);
    fn.exe = (exe_reconstructor *)local_1a0;
    fn.imgfs = (ImgfsFile *)compsize;
    section_enumerator<ImgfsFile::FileEntry::listentry(ImgfsFile&)::_lambda(std::shared_ptr<ImgfsFile::SectionEntry>)_2_>
              (this,(ImgfsFile *)compsize,fn);
    exe_reconstructor::printexe((exe_reconstructor *)local_1a0);
    exe_reconstructor::~exe_reconstructor((exe_reconstructor *)local_1a0);
  }
  return;
}

Assistant:

void listentry(ImgfsFile& imgfs)
        {
            if (g_verbose>1) {
                size_t compsize= calc_compressed_size(imgfs);
                printf("%08x: %c:s->%08x %9d %9d [%08x] %s  %s %s\n",
                        offset(), _magic==MAGIC?'F':'M', _sectionlist, _size, int(compsize), _attr,
                        unixtime2string(getunixtime()).c_str(), entstring().c_str(), _name.name(imgfs).c_str());
            }
            else {
                printf("%08x: %c:s->%08x %9d [%08x] %s  %s %s\n",
                        offset(), _magic==MAGIC?'F':'M', _sectionlist, _size, _attr,
                        unixtime2string(getunixtime()).c_str(), entstring().c_str(), _name.name(imgfs).c_str());
            }

            section_enumerator(imgfs,
                [&imgfs](SectionEntry_ptr section) {
                    section->listsection(imgfs);
                }
            );
            if (g_verbose && _sectionlist) {

                exe_reconstructor exe(imgfs.cputype());
                exe.add_pe_data(getdatablock(imgfs));
                section_enumerator(imgfs,
                    [&imgfs,&exe](SectionEntry_ptr section) {
                        exe.add_sectioninfo(section->ni().shortname(), section->size(), section->getdatareader(imgfs));
                    }
                );

                exe.printexe();
            }
        }